

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbmradix.c
# Opt level: O1

void rsorta(string *a,int n,int b)

{
  string *ppuVar1;
  byte bVar2;
  int b_00;
  int iVar3;
  string puVar4;
  string puVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  undefined8 *puVar14;
  string *a_00;
  long lVar15;
  string *ppuVar16;
  uint uVar17;
  uint uVar18;
  int *piVar19;
  int *piVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  undefined8 *puVar25;
  mbmstack_t stmp;
  string *pile [256];
  mbmstack_t stack [1024];
  string *local_4838 [254];
  undefined8 uStack_4048;
  int aiStack_4040 [2];
  string *local_4038;
  int local_4030 [4096];
  
  local_4038 = a;
  local_4030[0] = n;
  local_4030[1] = b;
  lVar11 = 0x10;
  do {
    lVar22 = lVar11 + -0x10;
    a_00 = *(string **)((long)&uStack_4048 + lVar11);
    iVar10 = *(int *)((long)aiStack_4040 + lVar11);
    lVar15 = (long)iVar10;
    b_00 = *(int *)((long)aiStack_4040 + lVar11 + 4);
    if (lVar15 < 10) {
      lVar11 = lVar22;
      if (1 < iVar10) {
        lVar23 = 1;
        lVar24 = 2;
        lVar21 = lVar24;
LAB_0024fa60:
        do {
          iVar10 = scmp(a_00[lVar24 + -2] + b_00,a_00[lVar24 + -1] + b_00);
          if (0 < iVar10) {
            puVar4 = a_00[lVar24 + -1];
            a_00[lVar24 + -1] = a_00[lVar24 + -2];
            a_00[lVar24 + -2] = puVar4;
            lVar24 = lVar24 + -1;
            if (1 < lVar24) goto LAB_0024fa60;
          }
          lVar23 = lVar23 + 1;
          lVar24 = lVar21 + 1;
          lVar21 = lVar24;
        } while (lVar23 != lVar15);
      }
    }
    else {
      ppuVar1 = a_00 + lVar15;
      if (rsorta::nc == 0) {
        rsorta::cmin = 0xff;
        uVar17 = 0xff;
        iVar13 = 0;
        ppuVar16 = a_00;
        do {
          bVar2 = (*ppuVar16)[b_00];
          iVar3 = rsorta::count[bVar2];
          rsorta::count[bVar2] = iVar3 + 1;
          if (iVar3 == 0 && bVar2 != 0) {
            uVar18 = (uint)bVar2;
            if (uVar18 < uVar17) {
              uVar17 = uVar18;
              rsorta::cmin = uVar18;
            }
            iVar13 = iVar13 + 1;
            rsorta::nc = iVar13;
          }
          ppuVar16 = ppuVar16 + 1;
        } while (ppuVar16 < ppuVar1);
        if (0x4000 < (long)rsorta::nc * 0x10 + lVar22) {
          rsorta(a_00,iVar10,b_00);
          lVar11 = lVar22;
          goto LAB_0024fb54;
        }
      }
      puVar25 = (undefined8 *)((long)&uStack_4048 + lVar11);
      ppuVar16 = a_00 + rsorta::count[0];
      local_4838[0] = ppuVar16;
      puVar14 = puVar25;
      if (rsorta::nc < 1) {
        lVar15 = 0;
      }
      else {
        piVar19 = rsorta::count + (uint)rsorta::cmin;
        iVar10 = 2;
        lVar21 = lVar22;
        do {
          lVar15 = (long)piVar19 * 0x40000000 + -0x31ad8d00000000;
          do {
            piVar20 = piVar19;
            lVar15 = lVar15 + 0x100000000;
            iVar13 = *piVar20;
            piVar19 = piVar20 + 1;
          } while (iVar13 == 0);
          lVar22 = lVar21;
          if (1 < iVar13) {
            if (iVar10 < iVar13) {
              iVar10 = iVar13;
              puVar14 = (undefined8 *)((long)&local_4038 + lVar21);
            }
            *(undefined8 *)((long)&local_4038 + lVar21) = ppuVar16;
            *(int *)((long)local_4030 + lVar21) = iVar13;
            lVar22 = lVar21 + 0x10;
            *(int *)((long)local_4030 + lVar21 + 4) = b_00 + 1;
          }
          ppuVar16 = ppuVar16 + *piVar20;
          lVar15 = lVar15 >> 0x20;
          local_4838[lVar15] = ppuVar16;
          bVar6 = 1 < rsorta::nc;
          lVar21 = lVar22;
          rsorta::nc = rsorta::nc + -1;
        } while (bVar6);
        rsorta::nc = 0;
      }
      uVar7 = *puVar25;
      uVar8 = *(undefined8 *)((long)aiStack_4040 + lVar11);
      uVar9 = puVar14[1];
      *puVar25 = *puVar14;
      *(undefined8 *)((long)aiStack_4040 + lVar11) = uVar9;
      *puVar14 = uVar7;
      puVar14[1] = uVar8;
      iVar10 = rsorta::count[lVar15];
      rsorta::count[lVar15] = 0;
      for (; lVar11 = lVar22, a_00 < ppuVar1 + -(long)iVar10; a_00 = a_00 + iVar13) {
        puVar4 = *a_00;
        uVar12 = (ulong)puVar4[b_00];
        ppuVar16 = local_4838[uVar12] + -1;
        local_4838[uVar12] = ppuVar16;
        while (a_00 < ppuVar16) {
          puVar5 = *ppuVar16;
          *ppuVar16 = puVar4;
          uVar12 = (ulong)puVar5[b_00];
          ppuVar16 = local_4838[uVar12] + -1;
          local_4838[uVar12] = ppuVar16;
          puVar4 = puVar5;
        }
        *a_00 = puVar4;
        iVar13 = rsorta::count[uVar12];
        rsorta::count[uVar12] = 0;
      }
    }
LAB_0024fb54:
    if (lVar11 < 1) {
      return;
    }
  } while( true );
}

Assistant:

static void rsorta(string *a, int n, int b)
{
#define push(a, n, i)   sp->sa = a, sp->sn = n, (sp++)->si = i
#define pop(a, n, i)    a = (--sp)->sa, n = sp->sn, i = sp->si
#define stackempty()    (sp <= stack)
#define swap(p, q, r)   r = p, p = q, q = r
        mbmstack_t      stack[SIZE], *sp = stack, stmp, *oldsp, *bigsp;
        string          *pile[256], *ak, *an, r, t;
        static int      count[256], cmin, nc;
        int             *cp, c, cmax;

        push(a, n, b);

        while(!stackempty()) {
                pop(a, n, b);
                if(n < THRESHOLD) {
                        simplesort(a, n, b);
                        continue;
                }
                an = a + n;
                if(nc == 0) {                       /* untallied? */
                        cmin = 255;                 /* tally */
                        for(ak = a; ak < an; ) {
                                c = (*ak++)[b];
                                if(++count[c] == 1 && c > 0) {
                                        if(c < cmin) cmin = c;
                                        nc++;
                                }
                        }
                        if(sp+nc > stack+SIZE) {     /* stack overflow */
                                  rsorta(a, n, b);
                                  continue;
                        }
                }
                oldsp = bigsp = sp, c = 2;         /* logartihmic stack */
                pile[0] = ak = a+count[cmax=0];    /* find places */
                for(cp = count+cmin; nc > 0; cp++, nc--) {
                         while(*cp == 0) cp++;
                         if (*cp > 1) {
                                  if(*cp > c) c = *cp, bigsp = sp;
                                  push(ak, *cp, b+1);
                         }
                         pile[cmax = cp-count] = ak += *cp;
                }
                swap(*oldsp, *bigsp, stmp);
                an -= count[cmax];                 /* permute home */
                count[cmax] = 0;
                for(ak = a; ak < an; ak += count[c], count[c] = 0) {
                        r = *ak;
                        while(--pile[c = r[b]] > ak)
                                swap(*pile[c], r, t);
                        *ak = r;
                                /* here nc = count[...] = 0 */
                }
        }
}